

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant_impl.hpp
# Opt level: O2

bool type_safe::detail::
     compare_variant<type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_>
     ::compare_equal(basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>
                     *a,basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>
                        *b)

{
  equal_visitor v;
  undefined1 local_9;
  
  if ((a->storage_).storage_.cur_type_.
      super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
      .value_ != 0) {
    local_9 = 0;
    with_union<type_safe::detail::compare_variant<type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>>::equal_visitor&,type_safe::tagged_union<int,double,debugger_type>const&,type_safe::union_types<int,double,debugger_type>,type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>const&>
    ::with_impl<int,double,debugger_type>(a,&local_9);
    return (bool)local_9;
  }
  return (b->storage_).storage_.cur_type_.
         super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
         .value_ == 0;
}

Assistant:

static bool compare_equal(const Variant& a, const Variant& b)
        {
            if (!a.has_value())
                // to be equal, b must not have value as well
                return !b.has_value();

            equal_visitor v;
            with(a, v, b);
            return v.result;
        }